

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcacheRemoveFromDirtyList(PgHdr *pPage)

{
  PCache *pPVar1;
  PgHdr *pPVar2;
  PgHdr *pPVar3;
  PCache *pPVar4;
  PgHdr **ppPVar5;
  
  pPVar1 = pPage->pCache;
  pPVar3 = pPage;
  if (pPVar1->pSynced == pPage) {
    do {
      pPVar3 = pPVar3->pDirtyPrev;
      if (pPVar3 == (PgHdr *)0x0) break;
    } while ((pPVar3->flags & 4) != 0);
    pPVar1->pSynced = pPVar3;
  }
  pPVar3 = pPage->pDirtyNext;
  pPVar2 = pPage->pDirtyPrev;
  ppPVar5 = &pPVar3->pDirtyPrev;
  if (pPVar3 == (PgHdr *)0x0) {
    ppPVar5 = &pPVar1->pDirtyTail;
  }
  pPVar4 = (PCache *)&pPVar2->pDirtyNext;
  if (pPVar2 == (PgHdr *)0x0) {
    pPVar4 = pPVar1;
  }
  *ppPVar5 = pPVar2;
  pPVar4->pDirty = pPVar3;
  pPage->pDirtyNext = (PgHdr *)0x0;
  pPage->pDirtyPrev = (PgHdr *)0x0;
  return;
}

Assistant:

static void pcacheRemoveFromDirtyList(PgHdr *pPage){
  PCache *p = pPage->pCache;

  assert( pPage->pDirtyNext || pPage==p->pDirtyTail );
  assert( pPage->pDirtyPrev || pPage==p->pDirty );

  /* Update the PCache1.pSynced variable if necessary. */
  if( p->pSynced==pPage ){
    PgHdr *pSynced = pPage->pDirtyPrev;
    while( pSynced && (pSynced->flags&PGHDR_NEED_SYNC) ){
      pSynced = pSynced->pDirtyPrev;
    }
    p->pSynced = pSynced;
  }

  if( pPage->pDirtyNext ){
    pPage->pDirtyNext->pDirtyPrev = pPage->pDirtyPrev;
  }else{
    assert( pPage==p->pDirtyTail );
    p->pDirtyTail = pPage->pDirtyPrev;
  }
  if( pPage->pDirtyPrev ){
    pPage->pDirtyPrev->pDirtyNext = pPage->pDirtyNext;
  }else{
    assert( pPage==p->pDirty );
    p->pDirty = pPage->pDirtyNext;
  }
  pPage->pDirtyNext = 0;
  pPage->pDirtyPrev = 0;

  expensive_assert( pcacheCheckSynced(p) );
}